

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O2

InfoInserzione __thiscall
ADE_DEP_DPFSP::miglioreInserzione
          (ADE_DEP_DPFSP *this,unsigned_short *vettoreFabbrica,
          unsigned_short dimensioneVettoreFabbrica,unsigned_short lavoroDaInserire)

{
  ushort uVar1;
  uint **ppuVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  undefined6 in_register_00000012;
  ulong uVar9;
  unsigned_short i;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  unsigned_short fabbrica [1];
  
  if ((int)CONCAT62(in_register_00000012,dimensioneVettoreFabbrica) == 0) {
    fabbrica[0] = lavoroDaInserire;
    uVar17 = valutaIndividuoParziale(this,fabbrica,1);
    uVar9 = 0;
  }
  else {
    uVar16 = (ulong)dimensioneVettoreFabbrica;
    uVar1 = (this->istanza).macchine;
    uVar10 = (ulong)uVar1;
    uVar9 = (ulong)uVar1;
    uVar12 = uVar9 * 4;
    puVar4 = (uint *)operator_new__(uVar12);
    puVar5 = (uint *)operator_new__(uVar12);
    pvVar6 = operator_new__((ulong)(this->istanza).lavori << 3);
    ppuVar2 = (this->istanza).p;
    uVar15 = dimensioneVettoreFabbrica - 1;
    for (uVar17 = uVar15; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
      pvVar7 = operator_new__(uVar12);
      uVar8 = (ulong)uVar17;
      *(void **)((long)pvVar6 + uVar8 * 8) = pvVar7;
      lVar11 = 0;
      while (0 < (long)(lVar11 + uVar10)) {
        if (lVar11 == 0 || uVar17 == uVar15) {
          if (uVar17 == uVar15 && lVar11 != 0) {
            uVar14 = ppuVar2[vettoreFabbrica[uVar8]][uVar9 + lVar11 + -1] +
                     *(int *)((long)pvVar7 + lVar11 * 4 + uVar12);
          }
          else {
            if (lVar11 == 0 && uVar17 != uVar15) {
              puVar3 = *(uint **)((long)pvVar6 + uVar8 * 8 + 8);
              uVar14 = ppuVar2[vettoreFabbrica[uVar8]][uVar9 + lVar11 + -1];
              goto LAB_00103cc8;
            }
            uVar14 = ppuVar2[vettoreFabbrica[uVar8]][uVar9 + lVar11 + -1];
          }
        }
        else {
          uVar13 = *(uint *)((long)pvVar7 + lVar11 * 4 + uVar12);
          uVar14 = *(uint *)(*(long *)((long)pvVar6 + uVar8 * 8 + 8) + uVar12 + -4 + lVar11 * 4);
          if (uVar14 < uVar13) {
            uVar14 = uVar13;
          }
          puVar3 = ppuVar2[vettoreFabbrica[uVar8]];
LAB_00103cc8:
          uVar14 = uVar14 + puVar3[uVar9 + lVar11 + -1];
        }
        *(uint *)((long)pvVar7 + (lVar11 + -1) * 4 + uVar12) = uVar14;
        lVar11 = lVar11 + -1;
      }
    }
    uVar17 = 0xffffffff;
    uVar15 = 0;
    for (uVar9 = 0; uVar9 != (dimensioneVettoreFabbrica + 1 & 0xffff); uVar9 = uVar9 + 1) {
      for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        if ((short)uVar12 == 0 && (short)uVar9 == 0) {
          *puVar5 = *ppuVar2[lavoroDaInserire];
          uVar13 = *ppuVar2[*vettoreFabbrica];
LAB_00103d9b:
          *puVar4 = uVar13;
        }
        else if (uVar12 == 0 && uVar9 != 0) {
          uVar13 = *puVar4;
          *puVar5 = *ppuVar2[lavoroDaInserire] + uVar13;
          if (uVar9 != uVar16) {
            uVar13 = uVar13 + *ppuVar2[vettoreFabbrica[uVar9]];
            goto LAB_00103d9b;
          }
        }
        else if (uVar12 == 0 || uVar9 != 0) {
          uVar13 = puVar4[uVar12];
          uVar14 = puVar5[uVar12 - 1];
          if (puVar5[uVar12 - 1] <= uVar13) {
            uVar14 = uVar13;
          }
          puVar5[uVar12] = uVar14 + ppuVar2[lavoroDaInserire][uVar12];
          if (uVar9 != uVar16) {
            if (uVar13 < puVar4[uVar12 - 1]) {
              uVar13 = puVar4[uVar12 - 1];
            }
            puVar4[uVar12] = uVar13 + ppuVar2[vettoreFabbrica[uVar9]][uVar12];
          }
        }
        else {
          uVar13 = (int)uVar12 - 1;
          puVar5[uVar12] = ppuVar2[lavoroDaInserire][uVar12] + puVar5[uVar13];
          puVar4[uVar12] = ppuVar2[*vettoreFabbrica][uVar12] + puVar4[uVar13];
        }
      }
      uVar13 = 0;
      for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        uVar14 = puVar5[uVar12];
        if (uVar9 != uVar16) {
          uVar14 = uVar14 + *(int *)(*(long *)((long)pvVar6 + uVar9 * 8) + uVar12 * 4);
        }
        if (uVar13 <= uVar14) {
          uVar13 = uVar14;
        }
      }
      bVar18 = uVar13 < uVar17;
      if (bVar18) {
        uVar17 = uVar13;
      }
      uVar13 = (uint)uVar9;
      if (!bVar18) {
        uVar13 = uVar15;
      }
      uVar15 = uVar13;
    }
    operator_delete__(puVar4);
    operator_delete__(puVar5);
    for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
      pvVar7 = *(void **)((long)pvVar6 + uVar9 * 8);
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
    }
    operator_delete__(pvVar6);
    uVar9 = (ulong)(uVar15 & 0xffff) << 0x20;
  }
  return (InfoInserzione)(uVar17 | uVar9);
}

Assistant:

ADE_DEP_DPFSP::InfoInserzione ADE_DEP_DPFSP::miglioreInserzione(unsigned short* vettoreFabbrica, 
	unsigned short dimensioneVettoreFabbrica,
	unsigned short lavoroDaInserire) {

	if (dimensioneVettoreFabbrica == 0) {
		unsigned short fabbrica[1] = { lavoroDaInserire };
		return { valutaIndividuoParziale(fabbrica, 1) , 0};
	}
		
	//Accelerazione di Taillard, guardare l'articolo relativo
	unsigned int* e = new unsigned int[istanza.macchine];
	unsigned int* f = new unsigned int[istanza.macchine];
	unsigned int** q = new unsigned int* [istanza.lavori];

	unsigned int miglioreMakespan = UINT32_MAX;
	unsigned short migliorePosizione = 0;

	for (int i = dimensioneVettoreFabbrica - 1; i >= 0; i--) {
		q[i] = new unsigned int[istanza.macchine];

		for (int j = istanza.macchine - 1; j >= 0; j--) {

			if (i != dimensioneVettoreFabbrica - 1 && j != istanza.macchine - 1) {
				q[i][j] = max(q[i][j + 1], q[i + 1][j]) + istanza.p[vettoreFabbrica[i]][j];
			}
			else if (i == dimensioneVettoreFabbrica - 1 && j != istanza.macchine - 1) {
				q[i][j] = q[i][j + 1] + istanza.p[vettoreFabbrica[i]][j];
			}
			else if (i != dimensioneVettoreFabbrica - 1 && j == istanza.macchine - 1) {
				q[i][j] = q[i + 1][j] + istanza.p[vettoreFabbrica[i]][j];
			}
			else {
				q[i][j] = istanza.p[vettoreFabbrica[i]][j];
			}	
		}
	}

	for (unsigned short i = 0; i <= dimensioneVettoreFabbrica; i++) {

		for (unsigned short j = 0; j < istanza.macchine; j++) {

			if (i == 0 && j == 0) {
				f[0] = istanza.p[lavoroDaInserire][0];
				e[0] = istanza.p[vettoreFabbrica[0]][0];
			}
			else if (i != 0 && j == 0) {
				f[0] = e[0] + istanza.p[lavoroDaInserire][0];

				if (i != dimensioneVettoreFabbrica)
					e[0] = e[0] + istanza.p[vettoreFabbrica[i]][0];
			}
			else if (i == 0 && j != 0) {
				f[j] = f[j - 1] + istanza.p[lavoroDaInserire][j];
				e[j] = e[j - 1] + istanza.p[vettoreFabbrica[0]][j];
			}
			else {
				f[j] = max(f[j - 1], e[j]) + istanza.p[lavoroDaInserire][j];
				if (i != dimensioneVettoreFabbrica)
					e[j] = max(e[j - 1], e[j]) + istanza.p[vettoreFabbrica[i]][j];
			}
		}

		unsigned int makeSpanParziale = 0;

		for (unsigned short j = 0; j < istanza.macchine; j++) {

			if (i != dimensioneVettoreFabbrica)
				makeSpanParziale = max(makeSpanParziale, f[j] + q[i][j]);
			else
				makeSpanParziale = max(makeSpanParziale, f[j]);
		}

		if (makeSpanParziale < miglioreMakespan) {
			miglioreMakespan = makeSpanParziale;
			migliorePosizione = i;
		}

	}

	delete[] e;
	delete[] f;

	for (unsigned short i = 0; i < dimensioneVettoreFabbrica; i++) {
		delete[] q[i];
	}

	delete[] q;

	return { miglioreMakespan, migliorePosizione };
}